

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

TryEmplaceResult * __thiscall
QHash<std::pair<QString,QString>,QString>::tryEmplace_impl<std::pair<QString,QString>const&>
          (QHash<std::pair<QString,_QString>,_QString> *this,pair<QString,_QString> *key)

{
  piter it;
  iterator it_00;
  bool bVar1;
  bool bVar2;
  size_t bucket_00;
  Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_> *in_RSI;
  TryEmplaceResult *in_RDI;
  long in_FS_OFFSET;
  Node *n;
  size_t bucketIndex;
  bool resized;
  bool shouldInsert;
  size_t hash;
  Bucket bucket;
  QHash<std::pair<QString,_QString>,_QString> detachGuard;
  pair<QString,_QString> *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  TryEmplaceResult *this_00;
  undefined1 in_stack_ffffffffffffff80 [16];
  Bucket local_30;
  Bucket local_20;
  QHash<std::pair<QString,_QString>,_QString> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  if (*(long *)in_RSI == 0) {
    QHash<std::pair<QString,_QString>,_QString>::detach
              ((QHash<std::pair<QString,_QString>,_QString> *)
               CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  }
  local_10.d = (Data *)0xaaaaaaaaaaaaaaaa;
  QHash<std::pair<QString,_QString>,_QString>::QHash(&local_10);
  QHashPrivate::calculateHash<std::pair<QString,QString>>
            ((pair<QString,_QString> *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60)
             ,(size_t)in_stack_ffffffffffffff58);
  local_20.index = 0xaaaaaaaaaaaaaaaa;
  local_20.span = (Span *)0xaaaaaaaaaaaaaaaa;
  local_20 = QHashPrivate::Data<QHashPrivate::Node<std::pair<QString,QString>,QString>>::
             findBucketWithHash<std::pair<QString,QString>>
                       (in_stack_ffffffffffffff80._8_8_,in_stack_ffffffffffffff80._0_8_,
                        (size_t)in_RSI);
  bVar1 = QHashPrivate::Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_>::Bucket::
          isUnused((Bucket *)0x3092a6);
  bVar2 = QHash<std::pair<QString,_QString>,_QString>::isDetached
                    ((QHash<std::pair<QString,_QString>,_QString> *)
                     CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  if ((!bVar2) ||
     ((bVar1 && (bVar2 = QHashPrivate::
                         Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_>::shouldGrow
                                   (*(Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_>
                                      **)in_RSI), bVar2)))) {
    QHash<std::pair<QString,_QString>,_QString>::operator=
              ((QHash<std::pair<QString,_QString>,_QString> *)this_00,
               (QHash<std::pair<QString,_QString>,_QString> *)in_RDI);
    bVar2 = false;
    if (bVar1) {
      bVar2 = QHashPrivate::Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_>::
              shouldGrow(*(Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_> **)in_RSI
                        );
    }
    in_stack_ffffffffffffff67 = bVar2;
    bucket_00 = QHashPrivate::Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_>::
                Bucket::toBucketIndex
                          (&local_20,
                           *(Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_> **)
                            in_RSI);
    if (bVar2 == false) {
      in_stack_ffffffffffffff58 =
           (pair<QString,_QString> *)
           QHashPrivate::Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_>::detached
                     (in_RSI);
    }
    else {
      in_stack_ffffffffffffff58 =
           (pair<QString,_QString> *)
           QHashPrivate::Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_>::detached
                     (in_RSI,(size_t)this_00);
    }
    *(pair<QString,_QString> **)in_RSI = in_stack_ffffffffffffff58;
    if (bVar2 == false) {
      QHashPrivate::Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_>::Bucket::Bucket
                (&local_30,
                 *(Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_> **)in_RSI,
                 bucket_00);
    }
    else {
      local_30 = QHashPrivate::Data<QHashPrivate::Node<std::pair<QString,QString>,QString>>::
                 findBucketWithHash<std::pair<QString,QString>>
                           (in_stack_ffffffffffffff80._8_8_,in_stack_ffffffffffffff80._0_8_,
                            (size_t)in_RSI);
    }
    local_20 = local_30;
  }
  if (bVar1) {
    QHashPrivate::Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_>::Bucket::insert
              ((Bucket *)0x3093e9);
    QHashPrivate::Node<std::pair<QString,_QString>,_QString>::createInPlace<>
              ((Node<std::pair<QString,_QString>,_QString> *)
               CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    *(long *)(*(long *)in_RSI + 8) = *(long *)(*(long *)in_RSI + 8) + 1;
  }
  QHashPrivate::Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_>::Bucket::toIterator
            ((Bucket *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
             (Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_> *)
             in_stack_ffffffffffffff58);
  it.d._7_1_ = in_stack_ffffffffffffff67;
  it.d._0_7_ = in_stack_ffffffffffffff60;
  it.bucket = (size_t)in_RDI;
  QHash<std::pair<QString,_QString>,_QString>::iterator::iterator
            ((iterator *)in_stack_ffffffffffffff58,it);
  it_00.i.d._7_1_ = in_stack_ffffffffffffff67;
  it_00.i.d._0_7_ = in_stack_ffffffffffffff60;
  it_00.i.bucket = (size_t)in_RDI;
  QHash<std::pair<QString,_QString>,_QString>::TryEmplaceResult::TryEmplaceResult
            ((TryEmplaceResult *)in_stack_ffffffffffffff58,it_00,false);
  QHash<std::pair<QString,_QString>,_QString>::~QHash
            ((QHash<std::pair<QString,_QString>,_QString> *)
             CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }